

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetDebugAttach
          (zet_device_handle_t hDevice,zet_debug_config_t *config,
          zet_debug_session_handle_t *phDebug)

{
  object_t<_zet_debug_session_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  zet_pfnDebugAttach_t pfnAttach;
  dditable_t *dditable;
  zet_debug_session_handle_t *pp_Stack_28;
  ze_result_t result;
  zet_debug_session_handle_t *phDebug_local;
  zet_debug_config_t *config_local;
  zet_device_handle_t hDevice_local;
  
  dditable._4_4_ = 0;
  pfnAttach = *(zet_pfnDebugAttach_t *)(hDevice + 8);
  if (*(code **)(pfnAttach + 0x820) == (code *)0x0) {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    config_local = *(zet_debug_config_t **)hDevice;
    pp_Stack_28 = phDebug;
    phDebug_local = (zet_debug_session_handle_t *)config;
    dditable._4_4_ = (**(code **)(pfnAttach + 0x820))(config_local,config,phDebug);
    hDevice_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_zet_debug_session_handle_t*>,_zet_debug_session_handle_t*>
               ::getInstance<_zet_debug_session_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_debug_session_handle_t*>,_zet_debug_session_handle_t*>
                           *)(context + 0xfc0),pp_Stack_28,(dditable_t **)&pfnAttach);
      *pp_Stack_28 = (zet_debug_session_handle_t)poVar1;
      hDevice_local._4_4_ = dditable._4_4_;
    }
  }
  return hDevice_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugAttach(
        zet_device_handle_t hDevice,                    ///< [in] device handle
        const zet_debug_config_t* config,               ///< [in] the debug configuration
        zet_debug_session_handle_t* phDebug             ///< [out] debug session handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_device_object_t*>( hDevice )->dditable;
        auto pfnAttach = dditable->zet.Debug.pfnAttach;
        if( nullptr == pfnAttach )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zet_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnAttach( hDevice, config, phDebug );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phDebug = reinterpret_cast<zet_debug_session_handle_t>(
                context->zet_debug_session_factory.getInstance( *phDebug, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }